

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

float similarity(string *s0,string *s1)

{
  size_type __n;
  size_type sVar1;
  size_type sVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer piVar5;
  size_t i;
  size_type sVar6;
  size_t i_1;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  allocator_type local_89;
  string *local_88;
  vector<int,_std::allocator<int>_> prevCol;
  value_type_conflict3 local_64;
  string *local_60;
  vector<int,_std::allocator<int>_> col;
  
  sVar1 = s0->_M_string_length;
  sVar2 = s1->_M_string_length;
  __n = sVar2 + 1;
  prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  local_88 = s1;
  local_60 = s0;
  std::vector<int,_std::allocator<int>_>::vector
            (&col,__n,(value_type_conflict3 *)&prevCol,(allocator_type *)&local_64);
  local_64 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&prevCol,__n,&local_64,&local_89);
  for (sVar6 = 0; __n != sVar6; sVar6 = sVar6 + 1) {
    prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sVar6] = (int)sVar6;
  }
  for (uVar7 = 0; uVar7 != sVar1 + 1; uVar7 = uVar7 + 1) {
    *col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (int)uVar7;
    pcVar3 = (local_60->_M_dataplus)._M_p;
    pcVar4 = (local_88->_M_dataplus)._M_p;
    uVar9 = uVar7 & 0xffffffff;
    for (uVar11 = 1; uVar11 < __n; uVar11 = uVar11 + 1) {
      uVar12 = 1;
      if (uVar7 != 0) {
        uVar12 = (uint)(pcVar3[uVar7 - 1] != pcVar4[uVar11 - 1]);
      }
      uVar8 = (int)uVar9 + 1;
      uVar10 = prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[uVar11] + 1U;
      if ((int)uVar8 <=
          (int)(prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar11] + 1U)) {
        uVar10 = uVar8;
      }
      if ((int)(uVar12 + prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11 - 1]) < (int)uVar10) {
        uVar10 = uVar12 + prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar11 - 1];
      }
      col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar11] = uVar10;
      uVar9 = (ulong)uVar10;
    }
    piVar5 = prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    col.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         piVar5;
  }
  uVar7 = local_88->_M_string_length;
  if (local_88->_M_string_length < local_60->_M_string_length) {
    uVar7 = local_60->_M_string_length;
  }
  local_88 = (string *)
             CONCAT44(local_88._4_4_,
                      1.0 - (float)prevCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[sVar2] / (float)uVar7);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&prevCol.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&col.super__Vector_base<int,_std::allocator<int>_>);
  return local_88._0_4_;
}

Assistant:

float similarity(const std::string & s0, const std::string & s1) {
    const size_t len0 = s0.size() + 1;
    const size_t len1 = s1.size() + 1;

    std::vector<int> col(len1, 0);
    std::vector<int> prevCol(len1, 0);

    for (size_t i = 0; i < len1; i++) {
        prevCol[i] = i;
    }

    for (size_t i = 0; i < len0; i++) {
        col[0] = i;
        for (size_t j = 1; j < len1; j++) {
            col[j] = std::min(std::min(1 + col[j - 1], 1 + prevCol[j]), prevCol[j - 1] + (i > 0 && s0[i - 1] == s1[j - 1] ? 0 : 1));
        }
        col.swap(prevCol);
    }

    const float dist = prevCol[len1 - 1];

    return 1.0f - (dist / std::max(s0.size(), s1.size()));
}